

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O0

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::handleConstantBitCast(LLVMPointerGraphBuilder *this,CastInst *BC)

{
  bool bVar1;
  ulong uVar2;
  Value *in_RSI;
  Value *in_RDI;
  Pointer PVar3;
  PSNode *op;
  Value *llvmOp;
  const_iterator *in_stack_ffffffffffffffa8;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffb8;
  Type *in_stack_ffffffffffffffd0;
  DataLayout *in_stack_ffffffffffffffd8;
  Pointer local_10;
  
  uVar2 = llvm::CastInst::isLosslessCast();
  if ((uVar2 & 1) == 0) {
    in_stack_ffffffffffffffa8 = (const_iterator *)llvm::Module::getDataLayout();
    llvm::Value::getType(in_RSI);
    bVar1 = llvmutils::typeCanBePointer(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    if (!bVar1) {
      local_10.offset.offset = _warn;
      local_10.target = UnknownPointer;
      return local_10;
    }
  }
  llvm::Value::stripPointerCasts();
  getOperand(in_stack_ffffffffffffffb8,in_RDI);
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_RDI);
  PVar3 = PointerIdPointsToSet::const_iterator::operator*(in_stack_ffffffffffffffa8);
  return PVar3;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::handleConstantBitCast(const llvm::CastInst *BC) {
    using namespace llvm;

    if (!BC->isLosslessCast()) {
        // If this is a cast to a bigger type (if that can ever happen?),
        // then preserve the pointer. Otherwise, the pointer is cropped,
        // and there's nothing we can do...
        if (!llvmutils::typeCanBePointer(&M->getDataLayout(), BC->getType()))
            return UnknownPointer;
        // fall-through
    }

    const Value *llvmOp = BC->stripPointerCasts();
    // (possibly recursively) get the operand of this bit-cast
    PSNode *op = getOperand(llvmOp);
    assert(op->pointsTo.size() == 1 &&
           "Constant BitCast with not only one pointer");

    return *op->pointsTo.begin();
}